

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O2

void run_centers_task(parallel_task_1d *task,size_t thread_id)

{
  real_t rVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  undefined8 uVar8;
  real_t in_XMM1_Da;
  vec3 vVar9;
  vec3 vVar10;
  vec3 b;
  vec3 b_00;
  
  sVar7 = (task->range).begin;
  uVar3 = (task->range).end;
  lVar5 = sVar7 * 0xc + 8;
  lVar6 = thread_id * 0x18;
  for (; sVar7 < uVar3; sVar7 = sVar7 + 1) {
    uVar8 = (*task[1].work_item.work_fn)(task[1].work_item.next,sVar7);
    sVar4 = task[1].range.begin;
    *(undefined8 *)((sVar4 - 8) + lVar5) = uVar8;
    *(real_t *)(sVar4 + lVar5) = in_XMM1_Da;
    sVar4 = task[1].range.end;
    uVar2 = *(undefined8 *)(sVar4 + 0xc + lVar6);
    rVar1 = *(real_t *)(sVar4 + 0x14 + lVar6);
    vVar9._[2] = *(real_t *)(sVar4 + 8 + lVar6);
    vVar9._._0_8_ = *(undefined8 *)(sVar4 + lVar6);
    b._[2] = in_XMM1_Da;
    b._[0] = (real_t)(int)uVar8;
    b._[1] = (real_t)(int)((ulong)uVar8 >> 0x20);
    vVar9 = min_vec3(vVar9,b);
    vVar10._[2] = rVar1;
    vVar10._._0_8_ = uVar2;
    b_00._[2] = in_XMM1_Da;
    b_00._[0] = (real_t)(int)uVar8;
    b_00._[1] = (real_t)(int)((ulong)uVar8 >> 0x20);
    vVar10 = max_vec3(vVar10,b_00);
    in_XMM1_Da = vVar10._[2];
    *(long *)(sVar4 + lVar6) = vVar9._._0_8_;
    *(real_t *)(sVar4 + 8 + lVar6) = vVar9._[2];
    *(long *)(sVar4 + 0xc + lVar6) = vVar10._._0_8_;
    *(real_t *)(sVar4 + 0x14 + lVar6) = in_XMM1_Da;
    lVar5 = lVar5 + 0xc;
  }
  return;
}

Assistant:

static void run_centers_task(struct parallel_task_1d* task, size_t thread_id) {
    struct centers_task* centers_task = (void*)task;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        struct vec3 center = centers_task->center_fn(centers_task->primitive_data, i);
        centers_task->centers[i] = center;
        centers_task->center_bboxes[thread_id] = extend_bbox(centers_task->center_bboxes[thread_id], center);
    }
}